

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O0

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  int iVar1;
  char *pcVar2;
  cmFunctionBlocker *pcVar3;
  cmListFileContext *pcVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference lff_00;
  bool bVar8;
  cmExecutionStatus local_1e0;
  uint local_1dc;
  cmExecutionStatus status;
  uint c;
  uint i;
  string err;
  undefined1 local_1a8 [7];
  bool isTrue;
  undefined1 local_188 [8];
  cmConditionEvaluator conditionEvaluator;
  cmCommandContext commandContext;
  cmListFileContext execContext;
  MessageType messageType;
  undefined1 local_88 [8];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  auto_ptr_ref<cmFunctionBlocker> local_40;
  auto_ptr<cmFunctionBlocker> fb;
  cmExecutionStatus *inStatus_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmWhileFunctionBlocker *this_local;
  
  fb.x_ = (cmFunctionBlocker *)inStatus;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"while");
  if (iVar1 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"endwhile");
    if (iVar1 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffffb8,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        local_40 = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref
                             ((auto_ptr *)&stack0xffffffffffffffb8);
        ::cm::auto_ptr<cmFunctionBlocker>::auto_ptr
                  ((auto_ptr<cmFunctionBlocker> *)&stack0xffffffffffffffc8,local_40);
        ::cm::auto_ptr<cmFunctionBlocker>::~auto_ptr
                  ((auto_ptr<cmFunctionBlocker> *)&stack0xffffffffffffffb8);
        pcVar3 = ::cm::auto_ptr<cmFunctionBlocker>::get
                           ((auto_ptr<cmFunctionBlocker> *)&stack0xffffffffffffffc8);
        if (pcVar3 == (cmFunctionBlocker *)0x0) {
          this_local._7_1_ = 0;
        }
        else {
          std::__cxx11::string::string
                    ((string *)
                     &expandedArguments.
                      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::vector
                    ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)local_88);
          cmMakefile::ExpandArguments
                    (mf,&this->Args,
                     (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)local_88,(char *)0x0);
          pcVar4 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
          cmListFileContext::cmListFileContext((cmListFileContext *)&commandContext.Line,pcVar4);
          cmCommandContext::cmCommandContext((cmCommandContext *)&conditionEvaluator.Policy57Status)
          ;
          commandContext.Name.field_2._8_8_ = execContext.FilePath.field_2._8_8_;
          std::__cxx11::string::operator=
                    ((string *)&conditionEvaluator.Policy57Status,(string *)&commandContext.Line);
          pcVar4 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
          cmMakefile::GetBacktrace
                    ((cmListFileBacktrace *)local_1a8,mf,
                     (cmCommandContext *)&conditionEvaluator.Policy57Status);
          cmConditionEvaluator::cmConditionEvaluator
                    ((cmConditionEvaluator *)local_188,mf,pcVar4,(cmListFileBacktrace *)local_1a8);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1a8);
          err.field_2._M_local_buf[0xf] =
               cmConditionEvaluator::IsTrue
                         ((cmConditionEvaluator *)local_188,
                          (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           *)local_88,
                          (string *)
                          &expandedArguments.
                           super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (MessageType *)&execContext.Line);
          while (err.field_2._M_local_buf[0xf] != '\0') {
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&i,"had incorrect arguments: ",(allocator *)((long)&c + 3));
              std::allocator<char>::~allocator((allocator<char> *)((long)&c + 3));
              status.ReturnInvoked = false;
              status.BreakInvoked = false;
              status.ContinueInvoked = false;
              status.NestedError = false;
              for (; uVar5 = (ulong)(uint)status,
                  sVar6 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size
                                    (&this->Args), uVar5 < sVar6;
                  status = (cmExecutionStatus)((int)status + 1)) {
                pvVar7 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
                         operator[](&this->Args,(ulong)(uint)status);
                pcVar2 = "PK\x01\x02";
                if (pvVar7->Delim != Unquoted) {
                  pcVar2 = "\n\t\t\t\"";
                }
                std::__cxx11::string::operator+=((string *)&i,pcVar2 + 4);
                pvVar7 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
                         operator[](&this->Args,(ulong)(uint)status);
                std::__cxx11::string::operator+=((string *)&i,(string *)pvVar7);
                pvVar7 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
                         operator[](&this->Args,(ulong)(uint)status);
                pcVar2 = "PK\x01\x02";
                if (pvVar7->Delim != Unquoted) {
                  pcVar2 = "\n\t\t\t\"";
                }
                std::__cxx11::string::operator+=((string *)&i,pcVar2 + 4);
                std::__cxx11::string::operator+=((string *)&i," ");
              }
              std::__cxx11::string::operator+=((string *)&i,"(");
              std::__cxx11::string::operator+=
                        ((string *)&i,
                         (string *)
                         &expandedArguments.
                          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::operator+=((string *)&i,").");
              cmMakefile::IssueMessage(mf,(MessageType)execContext.Line,(string *)&i);
              bVar8 = (MessageType)execContext.Line == FATAL_ERROR;
              if (bVar8) {
                cmSystemTools::SetFatalErrorOccured();
                this_local._7_1_ = 1;
              }
              std::__cxx11::string::~string((string *)&i);
              if (bVar8) goto LAB_007fcee5;
            }
            for (local_1dc = 0; uVar5 = (ulong)local_1dc,
                sVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                                  (&this->Functions), uVar5 < sVar6; local_1dc = local_1dc + 1) {
              cmExecutionStatus::cmExecutionStatus(&local_1e0);
              lff_00 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                       operator[](&this->Functions,(ulong)local_1dc);
              cmMakefile::ExecuteCommand(mf,lff_00,&local_1e0);
              bVar8 = cmExecutionStatus::GetReturnInvoked(&local_1e0);
              if (bVar8) {
                cmExecutionStatus::SetReturnInvoked((cmExecutionStatus *)fb.x_);
                this_local._7_1_ = 1;
                goto LAB_007fcee5;
              }
              bVar8 = cmExecutionStatus::GetBreakInvoked(&local_1e0);
              if (bVar8) {
                this_local._7_1_ = 1;
                goto LAB_007fcee5;
              }
              bVar8 = cmExecutionStatus::GetContinueInvoked(&local_1e0);
              if (bVar8) break;
              bVar8 = cmSystemTools::GetFatalErrorOccured();
              if (bVar8) {
                this_local._7_1_ = 1;
                goto LAB_007fcee5;
              }
            }
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            clear((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_88);
            cmMakefile::ExpandArguments
                      (mf,&this->Args,
                       (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        *)local_88,(char *)0x0);
            err.field_2._M_local_buf[0xf] =
                 cmConditionEvaluator::IsTrue
                           ((cmConditionEvaluator *)local_188,
                            (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             *)local_88,
                            (string *)
                            &expandedArguments.
                             super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (MessageType *)&execContext.Line);
          }
          this_local._7_1_ = 1;
LAB_007fcee5:
          cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_188);
          cmCommandContext::~cmCommandContext
                    ((cmCommandContext *)&conditionEvaluator.Policy57Status);
          cmListFileContext::~cmListFileContext((cmListFileContext *)&commandContext.Line);
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
          ~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_88);
          std::__cxx11::string::~string
                    ((string *)
                     &expandedArguments.
                      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        ::cm::auto_ptr<cmFunctionBlocker>::~auto_ptr
                  ((auto_ptr<cmFunctionBlocker> *)&stack0xffffffffffffffc8);
        goto LAB_007fcf99;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  this_local._7_1_ = 1;
LAB_007fcf99:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmWhileFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                               cmMakefile& mf,
                                               cmExecutionStatus& inStatus)
{
  // at end of for each execute recorded commands
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "while")) {
    // record the number of while commands past this one
    this->Depth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endwhile")) {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      CM_AUTO_PTR<cmFunctionBlocker> fb(mf.RemoveFunctionBlocker(this, lff));
      if (!fb.get()) {
        return false;
      }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      cmake::MessageType messageType;

      cmListFileContext execContext = this->GetStartingContext();

      cmCommandContext commandContext;
      commandContext.Line = execContext.Line;
      commandContext.Name = execContext.Name;

      cmConditionEvaluator conditionEvaluator(mf, this->GetStartingContext(),
                                              mf.GetBacktrace(commandContext));

      bool isTrue =
        conditionEvaluator.IsTrue(expandedArguments, errorString, messageType);

      while (isTrue) {
        if (!errorString.empty()) {
          std::string err = "had incorrect arguments: ";
          unsigned int i;
          for (i = 0; i < this->Args.size(); ++i) {
            err += (this->Args[i].Delim ? "\"" : "");
            err += this->Args[i].Value;
            err += (this->Args[i].Delim ? "\"" : "");
            err += " ";
          }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == cmake::FATAL_ERROR) {
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }
        }

        // Invoke all the functions that were collected in the block.
        for (unsigned int c = 0; c < this->Functions.size(); ++c) {
          cmExecutionStatus status;
          mf.ExecuteCommand(this->Functions[c], status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(expandedArguments, errorString,
                                           messageType);
      }
      return true;
    }
    // decrement for each nested while that ends
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}